

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::analysis::DebugInfoManager::KillDebugDeclares
          (DebugInfoManager *this,uint32_t variable_id)

{
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
  __it;
  bool bVar7;
  bool bVar8;
  set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>
  copy_dbg_decls;
  _Rb_tree<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::_Identity<spvtools::opt::Instruction_*>,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>
  local_60;
  
  uVar2 = (this->var_id_to_dbg_decl_)._M_h._M_bucket_count;
  uVar4 = (ulong)variable_id % uVar2;
  p_Var5 = (this->var_id_to_dbg_decl_)._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var5->_M_nxt, p_Var6 = p_Var5,
     *(uint32_t *)&p_Var5->_M_nxt[1]._M_nxt != variable_id)) {
    while (p_Var5 = p_Var3, p_Var3 = p_Var5->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var3[1]._M_nxt % uVar2 != uVar4) ||
         (p_Var6 = p_Var5, *(uint *)&p_Var3[1]._M_nxt == variable_id)) goto LAB_0055f79c;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_0055f79c:
  if (p_Var6 == (__node_base_ptr)0x0) {
    __it._M_cur = (__node_type *)0x0;
  }
  else {
    __it._M_cur = (__node_type *)p_Var6->_M_nxt;
  }
  if (__it._M_cur == (__node_type *)0x0) {
    bVar7 = false;
  }
  else {
    std::
    _Rb_tree<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::_Identity<spvtools::opt::Instruction_*>,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>
    ::_Rb_tree(&local_60,
               (_Rb_tree<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::_Identity<spvtools::opt::Instruction_*>,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>
                *)((long)__it._M_cur + 0x10));
    p_Var1 = &local_60._M_impl.super__Rb_tree_header;
    bVar7 = (_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1;
    bVar8 = bVar7;
    while (bVar8) {
      IRContext::KillInst(this->context_,
                          *(Instruction **)
                           (local_60._M_impl.super__Rb_tree_header._M_header._M_left + 1));
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)
           std::_Rb_tree_increment(local_60._M_impl.super__Rb_tree_header._M_header._M_left);
      bVar8 = (_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1;
    }
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(&(this->var_id_to_dbg_decl_)._M_h,(const_iterator)__it._M_cur);
    std::
    _Rb_tree<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::_Identity<spvtools::opt::Instruction_*>,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>
    ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
  }
  return bVar7;
}

Assistant:

bool DebugInfoManager::KillDebugDeclares(uint32_t variable_id) {
  bool modified = false;
  auto dbg_decl_itr = var_id_to_dbg_decl_.find(variable_id);
  if (dbg_decl_itr != var_id_to_dbg_decl_.end()) {
    // We intentionally copy the list of DebugDeclare instructions because
    // context()->KillInst(dbg_decl) will update |var_id_to_dbg_decl_|. If we
    // directly use |dbg_decl_itr->second|, it accesses a dangling pointer.
    auto copy_dbg_decls = dbg_decl_itr->second;

    for (auto* dbg_decl : copy_dbg_decls) {
      context()->KillInst(dbg_decl);
      modified = true;
    }
    var_id_to_dbg_decl_.erase(dbg_decl_itr);
  }
  return modified;
}